

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndColumns(void)

{
  undefined8 *puVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumns *pIVar4;
  ImGuiColumnData *pIVar5;
  undefined8 uVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  int iVar9;
  ImU32 col;
  ulong uVar10;
  long lVar11;
  ImGuiID id;
  ImGuiContext *g;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_ba;
  bool local_b9;
  undefined1 local_b8 [16];
  ulong local_a8;
  float local_9c;
  ImVec4 local_98;
  ImVec2 local_80;
  ImRect local_78;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImGuiContext *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  pIVar4 = (pIVar3->DC).CurrentColumns;
  if (pIVar4 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x21c0,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < pIVar4->Count) {
    PopClipRect();
    ImDrawList::ChannelsMerge(pIVar3->DrawList);
  }
  fVar14 = (pIVar3->DC).CursorPos.y;
  uVar13 = -(uint)(fVar14 <= pIVar4->LineMaxY);
  local_68 = (float)(~uVar13 & (uint)fVar14 | (uint)pIVar4->LineMaxY & uVar13);
  pIVar4->LineMaxY = local_68;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  (pIVar3->DC).CursorPos.y = local_68;
  uVar13 = pIVar4->Flags;
  if ((uVar13 & 0x10) == 0) {
    (pIVar3->DC).CursorMaxPos.x = pIVar4->BackupCursorMaxPosX;
  }
  if (((uVar13 & 1) == 0) && (pIVar3->SkipItems == false)) {
    uVar13 = pIVar4->Count;
    iVar9 = -1;
    if (1 < (int)uVar13) {
      local_50 = pIVar7;
      fVar14 = (pIVar3->ClipRect).Min.y;
      uVar13 = -(uint)(fVar14 <= pIVar4->BackupCursorPosY);
      local_48 = (float)(~uVar13 & (uint)fVar14 | (uint)pIVar4->BackupCursorPosY & uVar13);
      fVar14 = (pIVar3->ClipRect).Max.y;
      if (fVar14 <= local_68) {
        local_68 = fVar14;
      }
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      local_9c = local_48 + 1.0;
      local_a8 = 0xffffffff;
      uVar12 = 1;
      lVar11 = 0x24;
      do {
        if ((long)(pIVar4->Columns).Size <= (long)uVar12) goto LAB_0012ab07;
        pIVar5 = (pIVar4->Columns).Data;
        local_b8._0_4_ = (pIVar3->Pos).x;
        fVar14 = GetColumnOffset((int)uVar12);
        pIVar7 = GImGui;
        local_b8._0_4_ = fVar14 + (float)local_b8._0_4_;
        id = pIVar4->ID + (int)uVar12;
        local_78.Min.x = (float)local_b8._0_4_ + -4.0;
        local_b8._4_4_ = extraout_XMM0_Db;
        local_b8._8_4_ = extraout_XMM0_Dc;
        local_b8._12_4_ = extraout_XMM0_Dd;
        local_78.Max.x = (float)local_b8._0_4_ + 4.0;
        local_78.Min.y = local_48;
        local_78.Max.y = local_68;
        if (id == GImGui->ActiveId) {
          GImGui->ActiveIdIsAlive = id;
        }
        if (id == pIVar7->ActiveIdPreviousFrame) {
          pIVar7->ActiveIdPreviousFrameIsAlive = true;
        }
        bVar8 = IsClippedEx(&local_78,id,false);
        if (!bVar8) {
          local_b9 = false;
          local_ba = false;
          if ((pIVar4->Flags & 2) == 0) {
            ButtonBehavior(&local_78,id,&local_b9,&local_ba,0);
            if ((local_b9 != false) || (local_ba == true)) {
              local_50->MouseCursor = 4;
            }
            if (local_ba == true) {
              if ((*(byte *)((long)&pIVar5->OffsetNorm + lVar11) & 2) == 0) {
                local_a8 = uVar12;
              }
              local_a8 = local_a8 & 0xffffffff;
            }
          }
          iVar9 = (local_b9 & 1) + 0x1b;
          if (local_ba != false) {
            iVar9 = 0x1d;
          }
          puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar9 << 4));
          local_98._0_8_ = *puVar1;
          uVar6 = puVar1[1];
          local_98.w = (float)((ulong)uVar6 >> 0x20);
          local_98.z = (float)uVar6;
          local_98.w = (GImGui->Style).Alpha * local_98.w;
          col = ColorConvertFloat4ToU32(&local_98);
          local_80.x = (float)(int)(float)local_b8._0_4_;
          local_98.y = local_9c;
          local_98.x = local_80.x;
          local_80.y = local_68;
          ImDrawList::AddLine(pIVar3->DrawList,(ImVec2 *)&local_98,&local_80,col,1.0);
        }
        uVar12 = uVar12 + 1;
        uVar13 = pIVar4->Count;
        lVar11 = lVar11 + 0x1c;
      } while ((long)uVar12 < (long)(int)uVar13);
      iVar9 = (int)local_a8;
    }
    if (iVar9 != -1) {
      if ((-1 < (int)uVar13) && (pIVar4->IsBeingResized == false)) {
        uVar2 = (pIVar4->Columns).Size;
        uVar10 = 0;
        uVar12 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar12 = uVar10;
        }
        do {
          if (uVar12 * 0x1c == uVar10) {
LAB_0012ab07:
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                          ,0x4d7,
                          "T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
          }
          pIVar5 = (pIVar4->Columns).Data;
          *(undefined4 *)((long)&pIVar5->OffsetNormBeforeResize + uVar10) =
               *(undefined4 *)((long)&pIVar5->OffsetNorm + uVar10);
          uVar10 = uVar10 + 0x1c;
        } while ((ulong)uVar13 * 0x1c + 0x1c != uVar10);
      }
      pIVar4->IsBeingResized = true;
      pIVar7 = GImGui;
      if (iVar9 < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x2104,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      if (GImGui->ActiveId != pIVar4->ID + iVar9) {
        __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x2105,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      local_b8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar14 = GetColumnOffset(iVar9 + -1);
      fVar14 = fVar14 + (pIVar7->Style).ColumnsMinSpacing;
      uVar13 = -(uint)(fVar14 <= (float)local_b8._0_4_);
      fVar14 = (float)(~uVar13 & (uint)fVar14 | local_b8._0_4_ & uVar13);
      if ((pIVar4->Flags & 4) != 0) {
        local_b8._4_4_ = local_b8._4_4_ & extraout_XMM0_Db_00;
        local_b8._0_4_ = fVar14;
        local_b8._8_4_ = local_b8._8_4_ & extraout_XMM0_Dc_00;
        local_b8._12_4_ = local_b8._12_4_ & extraout_XMM0_Dd_00;
        fVar15 = GetColumnOffset(iVar9 + 1);
        fVar15 = fVar15 - (pIVar7->Style).ColumnsMinSpacing;
        fVar14 = (float)local_b8._0_4_;
        if (fVar15 <= (float)local_b8._0_4_) {
          fVar14 = fVar15;
        }
      }
      SetColumnOffset(iVar9,fVar14);
    }
    bVar8 = iVar9 != -1;
  }
  else {
    bVar8 = false;
  }
  pIVar4->IsBeingResized = bVar8;
  (pIVar3->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar3->DC).ColumnsOffset.x = 0.0;
  (pIVar3->DC).CursorPos.x = (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->BackupCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->BackupCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}